

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test::
ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test
          (ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test *this)

{
  ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test_00891ad0;
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetReissuanceListTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx1(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000003017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx2(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000005017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000011e1a30003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000017d7840002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa16001435ef6d4b59f26089dfe2abca21408e15fee42a3300000000");

  std::vector<Amount> amount_list;
  std::vector<Script> script_list;
  std::vector<ConfidentialNonce> nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount amount = Amount::CreateByCoinAmount(7.0);
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount amount1 = Amount::CreateByCoinAmount(3.0);
  Amount amount2 = Amount::CreateByCoinAmount(4.0);
  Script script1("76a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac");
  Script script2("001435ef6d4b59f26089dfe2abca21408e15fee42a33");
  ConfidentialNonce nonce1("03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef311687");
  ConfidentialNonce nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  amount_list.push_back(amount1);
  script_list.push_back(script1);
  nonce_list.push_back(nonce1);
  amount_list.push_back(amount2);
  script_list.push_back(script2);
  nonce_list.push_back(nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.clear();
    script_list.clear();
    nonce_list.clear();
    amount_list.push_back(amount);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
    script_list.push_back(script1);
    EXPECT_THROW(param = tx_base.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    script_list.clear();
  }
  // error (amount unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.push_back(amount1);
    script_list.push_back(script1);
    nonce_list.push_back(nonce1);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
  }
}